

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O0

void __thiscall TPZOneShapeRestraint::Write(TPZOneShapeRestraint *this,TPZStream *buf)

{
  int iVar1;
  long lVar2;
  pair<long,_int> *ppVar3;
  long *plVar4;
  int *piVar5;
  TPZManVector<long,_4> *in_RSI;
  TPZVec<std::pair<long,_int>_> *in_RDI;
  int i;
  TPZManVector<int,_4> faces;
  TPZManVector<long,_4> seqnums;
  int64_t in_stack_ffffffffffffff28;
  TPZManVector<long,_4> *in_stack_ffffffffffffff30;
  TPZManVector<long,_4> *pTVar6;
  int local_90;
  TPZVec<int> local_80;
  TPZVec<long> local_50 [2];
  TPZManVector<long,_4> *local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_4>::TPZManVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
    ppVar3 = TPZVec<std::pair<long,_int>_>::operator[](in_RDI,(long)local_90);
    lVar2 = ppVar3->first;
    plVar4 = TPZVec<long>::operator[](local_50,(long)local_90);
    *plVar4 = lVar2;
    ppVar3 = TPZVec<std::pair<long,_int>_>::operator[](in_RDI,(long)local_90);
    iVar1 = ppVar3->second;
    piVar5 = TPZVec<int>::operator[](&local_80,(long)local_90);
    *piVar5 = iVar1;
  }
  pTVar6 = local_10;
  plVar4 = TPZVec<long>::operator[](local_50,0);
  (*(pTVar6->super_TPZVec<long>)._vptr_TPZVec[5])(pTVar6,plVar4,4);
  pTVar6 = local_10;
  piVar5 = TPZVec<int>::operator[](&local_80,0);
  (*(pTVar6->super_TPZVec<long>)._vptr_TPZVec[3])(pTVar6,piVar5,4);
  piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 3),0);
  (*(local_10->super_TPZVec<long>)._vptr_TPZVec[3])(local_10,piVar5,4);
  TPZManVector<int,_4>::~TPZManVector((TPZManVector<int,_4> *)local_10);
  TPZManVector<long,_4>::~TPZManVector(local_10);
  return;
}

Assistant:

void Write(TPZStream &buf) const
    {
        TPZManVector<int64_t,4> seqnums(4);
        TPZManVector<int,4> faces(4);
        for (int i=0; i<4; i++)
        {
            seqnums[i] = fFaces[i].first;
            faces[i] = fFaces[i].second;
        }
        buf.Write(&seqnums[0],4);
        buf.Write(&faces[0],4);
        buf.Write(&fOrient[0],4);
    }